

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdatawidgetmapper.cpp
# Opt level: O0

void __thiscall
QDataWidgetMapper::setItemDelegate(QDataWidgetMapper *this,QAbstractItemDelegate *delegate)

{
  long lVar1;
  QDataWidgetMapperPrivate *pQVar2;
  QAbstractItemDelegate *in_RSI;
  long in_FS_OFFSET;
  Function unaff_retaddr;
  offset_in_QAbstractItemDelegate_to_subr in_stack_00000010;
  QAbstractItemDelegate *oldDelegate;
  QDataWidgetMapperPrivate *d;
  code *in_stack_ffffffffffffff88;
  QDataWidgetMapperPrivate *in_stack_ffffffffffffff90;
  code *in_stack_ffffffffffffff98;
  undefined8 in_stack_ffffffffffffffd0;
  ConnectionType type;
  code *receiverPrivate;
  Object *sender;
  
  type = (ConnectionType)((ulong)in_stack_ffffffffffffffd0 >> 0x20);
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar2 = d_func((QDataWidgetMapper *)0x870a10);
  QDataWidgetMapperPrivate::disconnectDelegate(in_stack_ffffffffffffff90);
  pQVar2->delegate = in_RSI;
  if (in_RSI != (QAbstractItemDelegate *)0x0) {
    in_stack_ffffffffffffff98 = QAbstractItemDelegate::commitData;
    receiverPrivate = QDataWidgetMapperPrivate::commitData;
    sender = (Object *)0x0;
    QObjectPrivate::
    connect<void(QAbstractItemDelegate::*)(QWidget*),void(QDataWidgetMapperPrivate::*)(QWidget*)>
              ((Object *)0x0,in_stack_00000010,(Object *)QDataWidgetMapperPrivate::commitData,
               unaff_retaddr,type);
    in_stack_ffffffffffffff88 = QAbstractItemDelegate::closeEditor;
    in_stack_ffffffffffffff90 = (QDataWidgetMapperPrivate *)0x0;
    QObjectPrivate::
    connect<void(QAbstractItemDelegate::*)(QWidget*,QAbstractItemDelegate::EndEditHint),void(QDataWidgetMapperPrivate::*)(QWidget*,QAbstractItemDelegate::EndEditHint)>
              (sender,in_stack_00000010,(Object *)receiverPrivate,unaff_retaddr,AutoConnection);
    std::array<QMetaObject::Connection,_2UL>::operator=
              ((array<QMetaObject::Connection,_2UL> *)in_stack_ffffffffffffff90,
               (array<QMetaObject::Connection,_2UL> *)in_stack_ffffffffffffff88);
    std::array<QMetaObject::Connection,_2UL>::~array
              ((array<QMetaObject::Connection,_2UL> *)in_stack_ffffffffffffff90);
  }
  QDataWidgetMapperPrivate::flipEventFilters
            ((QDataWidgetMapperPrivate *)in_stack_ffffffffffffff98,
             (QAbstractItemDelegate *)in_stack_ffffffffffffff90,
             (QAbstractItemDelegate *)in_stack_ffffffffffffff88);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QDataWidgetMapper::setItemDelegate(QAbstractItemDelegate *delegate)
{
    Q_D(QDataWidgetMapper);
    QAbstractItemDelegate *oldDelegate = d->delegate;
    d->disconnectDelegate();

    d->delegate = delegate;

    if (delegate) {
        d->delegateConnections = {
            QObjectPrivate::connect(delegate, &QAbstractItemDelegate::commitData,
                                    d, &QDataWidgetMapperPrivate::commitData),
            QObjectPrivate::connect(delegate, &QAbstractItemDelegate::closeEditor,
                                    d, &QDataWidgetMapperPrivate::closeEditor)
        };
    }

    d->flipEventFilters(oldDelegate, delegate);
}